

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PauliZ.hpp
# Opt level: O1

SquareMatrix<std::complex<double>_> __thiscall
qclab::qgates::PauliZ<std::complex<double>_>::matrix(PauliZ<std::complex<double>_> *this)

{
  undefined8 *puVar1;
  SquareMatrix<std::complex<double>_> SVar2;
  
  (this->super_QGate1<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject =
       (_func_int **)0x2;
  puVar1 = (undefined8 *)operator_new__(0x40);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  puVar1[6] = 0;
  puVar1[7] = 0;
  *(undefined8 **)&(this->super_QGate1<std::complex<double>_>).qubit_ = puVar1;
  *puVar1 = 0x3ff0000000000000;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  puVar1[6] = &DAT_bff0000000000000;
  puVar1[7] = 0;
  SVar2.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
          )&DAT_bff0000000000000;
  SVar2.size_ = (size_type_conflict)this;
  return SVar2;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          return qclab::dense::SquareMatrix< T >( 1 ,  0 ,
                                                  0 , -1 ) ;
        }